

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  uint uVar1;
  uint uVar2;
  runtime_error *this_00;
  char (*pacVar3) [12];
  char (*ts_1) [13];
  uint uVar4;
  float fVar5;
  uint uVar6;
  char (*in_R9) [2];
  SPIRType type;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [20];
  float local_1cc;
  string local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  string local_1a0;
  undefined **local_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 *local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_1a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1a8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (c->m).c[col].r[row].u32;
  uVar2 = (uVar1 & 0xffff) >> 0xf;
  uVar4 = uVar1 >> 10 & 0x1f;
  uVar6 = uVar1 & 0x3ff;
  if (uVar4 == 0x1f) {
    uVar2 = uVar2 << 0x1f;
    if (uVar6 != 0) {
      uVar2 = uVar2 | (uVar1 & 0xffff) << 0xd;
    }
    fVar5 = (float)(uVar2 | 0x7f800000);
  }
  else {
    if (uVar4 == 0) {
      if (uVar6 == 0) {
        fVar5 = (float)(uVar2 << 0x1f);
        goto LAB_00754d39;
      }
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar4 = (uVar1 ^ 0xffffffe0) + 0x17;
      uVar6 = uVar6 << (~(byte)uVar1 + 0xb & 0x1f) & 0x1fffbfe;
    }
    fVar5 = (float)(uVar4 * 0x800000 + 0x38000000 | uVar2 << 0x1f | uVar6 << 0xd);
  }
LAB_00754d39:
  if ((NAN(fVar5) || NAN(fVar5)) || ABS(fVar5) == INFINITY) {
    local_178 = 0;
    local_180 = &PTR__SPIRType_00b70cc8;
    uStack_16c = 0;
    uStack_158 = 0;
    local_150 = 8;
    uStack_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_f8 = local_e0;
    uStack_f0 = 0;
    local_e8 = 8;
    uStack_b8 = 0;
    local_b0 = 8;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_7c = 0;
    uStack_74 = 0;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 0xc00000016;
    uStack_168 = 1;
    uStack_164 = 1;
    local_160 = local_148;
    local_128 = local_110;
    local_c0 = local_a8;
    if (fVar5 < INFINITY) {
      if (-INFINITY < fVar5) {
        if (!NAN(fVar5)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this_00,"Cannot represent non-finite floating point constant.");
          *(undefined ***)this_00 = &PTR__runtime_error_00b70ca0;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pacVar3 = (char (*) [12])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f0,this,&local_180);
        join<std::__cxx11::string,char_const(&)[12]>
                  (&local_1c8,(diligent_spirv_cross *)local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(0.0 / 0.0)",pacVar3);
      }
      else {
        ts_1 = (char (*) [13])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f0,this,&local_180);
        join<std::__cxx11::string,char_const(&)[13]>
                  (&local_1c8,(diligent_spirv_cross *)local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(-1.0 / 0.0)",ts_1);
      }
    }
    else {
      pacVar3 = (char (*) [12])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f0,this,&local_180);
      join<std::__cxx11::string,char_const(&)[12]>
                (&local_1c8,(diligent_spirv_cross *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(1.0 / 0.0)",
                 pacVar3);
    }
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    local_180 = &PTR__SPIRType_00b70cc8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    uStack_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    uStack_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    uStack_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    if (local_160 == local_148) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_178 = 0;
    local_180 = &PTR__SPIRType_00b70cc8;
    uStack_16c = 0;
    uStack_158 = 0;
    local_150 = 8;
    uStack_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    uStack_f0 = 0;
    local_e8 = 8;
    uStack_b8 = 0;
    local_b0 = 8;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_7c = 0;
    uStack_74 = 0;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 0xc00000016;
    uStack_168 = 1;
    uStack_164 = 1;
    local_1cc = fVar5;
    local_160 = local_148;
    local_128 = local_110;
    local_f8 = local_e0;
    local_c0 = local_a8;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f0,this,&local_180,0);
    format_float_abi_cxx11_(&local_1a0,this,local_1cc);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_1c8,(diligent_spirv_cross *)local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82e2c3,
               (char (*) [2])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x930f15,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    local_180 = &PTR__SPIRType_00b70cc8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    uStack_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    uStack_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    uStack_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    if (local_160 == local_148) {
      return __return_storage_ptr__;
    }
  }
  uStack_158 = 0;
  free(local_160);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", format_float(float_value), ")");
	}

	return res;
}